

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_0::targetToName(deUint32 target)

{
  char *pcStack_10;
  deUint32 target_local;
  
  if (target == 0xde1) {
    pcStack_10 = "texture2d";
  }
  else if (target == 0x806f) {
    pcStack_10 = "texture3d";
  }
  else if (target == 0x8513) {
    pcStack_10 = "cubemap";
  }
  else if (target == 0x8c1a) {
    pcStack_10 = "texture2d_array";
  }
  else if (target == 0x8d41) {
    pcStack_10 = "renderbuffer";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* targetToName (deUint32 target)
{
	switch (target)
	{
		case GL_RENDERBUFFER:		return "renderbuffer";
		case GL_TEXTURE_2D:			return "texture2d";
		case GL_TEXTURE_3D:			return "texture3d";
		case GL_TEXTURE_2D_ARRAY:	return "texture2d_array";
		case GL_TEXTURE_CUBE_MAP:	return "cubemap";

		default:
			DE_ASSERT(false);
			return NULL;
	}
}